

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddCompileOption(cmMakefile *this,char *option)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"COMPILE_OPTIONS",&local_39);
  AppendProperty(this,&local_38,option,false);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmMakefile::AddCompileOption(const char* option)
{
  this->AppendProperty("COMPILE_OPTIONS", option);
}